

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.cc
# Opt level: O3

void google::protobuf::internal::InitImplicitWeakMessageDefaultInstance(void)

{
  _DAT_003c6bb8 = 0;
  implicit_weak_message_default_instance = &PTR__ImplicitWeakMessage_003b7d98;
  DAT_003c6bc0 = &DAT_003c6bd0;
  DAT_003c6bc8 = 0;
  DAT_003c6bd0 = 0;
  return;
}

Assistant:

void InitImplicitWeakMessageDefaultInstance() {
  implicit_weak_message_default_instance.DefaultConstruct();
}